

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O1

ze_result_t loader::zetDebugDetach(zet_debug_session_handle_t hDebug)

{
  _zet_debug_session_handle_t *_key;
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hDebug + 8) + 0x828) == (code *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_zet_debug_session_handle_t **)hDebug;
    zVar1 = (**(code **)(*(long *)(hDebug + 8) + 0x828))(_key);
    if (zVar1 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_zet_debug_session_handle_t_*>,__zet_debug_session_handle_t_*>::
      release((singleton_factory_t<object_t<_zet_debug_session_handle_t_*>,__zet_debug_session_handle_t_*>
               *)(context + 0xfc0),_key);
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugDetach(
        zet_debug_session_handle_t hDebug               ///< [in][release] debug session handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_debug_session_object_t*>( hDebug )->dditable;
        auto pfnDetach = dditable->zet.Debug.pfnDetach;
        if( nullptr == pfnDetach )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDebug = reinterpret_cast<zet_debug_session_object_t*>( hDebug )->handle;

        // forward to device-driver
        result = pfnDetach( hDebug );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->zet_debug_session_factory.release( hDebug );

        return result;
    }